

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ParenthesizedSequenceExprSyntax::getChild
          (ParenthesizedSequenceExprSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *pTVar1;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    pTVar1 = in_RDI;
    not_null<slang::syntax::SequenceExprSyntax_*>::get
              ((not_null<slang::syntax::SequenceExprSyntax_*> *)&in_RSI[2].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    in_RDI = pTVar1;
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    break;
  case 3:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ParenthesizedSequenceExprSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return expr.get();
        case 2: return matchList;
        case 3: return closeParen;
        case 4: return repetition;
        default: return nullptr;
    }
}